

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O0

bool __thiscall Json::JsonArray::put(JsonArray *this,shared_ptr<Json::JsonValue> *jsonValue)

{
  bool bVar1;
  element_type *jsonValue_00;
  element_type *peVar2;
  byte bVar3;
  undefined8 extraout_RDX;
  __normal_iterator<std::shared_ptr<Json::JsonValue>_*,_std::vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<Json::JsonValue>_*,_std::vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>_>
  local_28;
  __shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2> *local_20;
  shared_ptr<Json::JsonValue> *jsonValue_local;
  JsonArray *this_local;
  
  local_20 = &jsonValue->super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
  jsonValue_local = (shared_ptr<Json::JsonValue> *)this;
  bVar1 = std::operator==(jsonValue,(nullptr_t)0x0);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    jsonValue_00 = std::__shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>::get(local_20);
    local_28._M_current = (shared_ptr<Json::JsonValue> *)find(this,jsonValue_00);
    local_30._M_current =
         (shared_ptr<Json::JsonValue> *)
         std::
         vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
         ::end(&this->__lstJsonArray);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      peVar2 = std::__shared_ptr_access<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
      bVar3 = (this->super_JsonFormatter).field_0x26 & 1;
      (*peVar2->_vptr_JsonValue[6])(peVar2,(ulong)bVar3,extraout_RDX,bVar3);
      std::
      vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>::
      push_back(&this->__lstJsonArray,(value_type *)local_20);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Json::JsonArray::put(const std::shared_ptr<JsonValue> &jsonValue) {
    if (jsonValue == nullptr)return false;
    if (find(jsonValue.get()) != __lstJsonArray.end())return false;
    jsonValue->setEscapeChar(__escape);
    __lstJsonArray.push_back(jsonValue);
    return true;
}